

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall Parser::matchAny(Parser *this,vector<TokenType,_std::allocator<TokenType>_> *types)

{
  bool bVar1;
  reference pTVar2;
  TokenType *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TokenType,_std::allocator<TokenType>_> *__range1;
  vector<TokenType,_std::allocator<TokenType>_> *types_local;
  Parser *this_local;
  
  __end1 = std::vector<TokenType,_std::allocator<TokenType>_>::begin(types);
  type = (TokenType *)std::vector<TokenType,_std::allocator<TokenType>_>::end(types);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_TokenType_*,_std::vector<TokenType,_std::allocator<TokenType>_>_>
                                *)&type);
    if (!bVar1) {
      return false;
    }
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_TokenType_*,_std::vector<TokenType,_std::allocator<TokenType>_>_>
             ::operator*(&__end1);
    bVar1 = match(this,*pTVar2);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_TokenType_*,_std::vector<TokenType,_std::allocator<TokenType>_>_>::
    operator++(&__end1);
  }
  return true;
}

Assistant:

bool Parser::matchAny(const std::vector<TokenType>& types) {
    for(const TokenType& type : types) {
        if(match(type))
            return true;
    }
    return false;
}